

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerialize
          (ExtensionSet *this,MessageLite *extendee,int start_field_number,int end_field_number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  iterator iVar3;
  int iStack_3c;
  EpsCopyOutputStream *pEStack_38;
  
  if (this->flat_size_ == 0) {
    return target;
  }
  iStack_3c = start_field_number;
  pEStack_38 = stream;
  if ((short)this->flat_size_ < 0) {
    pKVar1 = (this->map_).flat;
    for (iVar3 = std::
                 _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                 ::lower_bound((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                                *)pKVar1,&iStack_3c);
        ((_Rb_tree_header *)iVar3._M_node != (_Rb_tree_header *)&pKVar1->second &&
        ((int)iVar3._M_node[1]._M_color < end_field_number));
        iVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node)) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         ((Extension *)&iVar3._M_node[1]._M_parent,extendee,this,
                          iVar3._M_node[1]._M_color,target,pEStack_38);
    }
  }
  else {
    pKVar1 = flat_end(this);
    pKVar2 = flat_begin(this);
    for (pKVar2 = std::
                  __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue_const*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                            (pKVar2,pKVar1,&iStack_3c);
        (pKVar2 != pKVar1 && (pKVar2->first < end_field_number)); pKVar2 = pKVar2 + 1) {
      target = Extension::InternalSerializeFieldWithCachedSizesToArray
                         (&pKVar2->second,extendee,this,pKVar2->first,target,pEStack_38);
    }
  }
  return target;
}

Assistant:

uint8_t* _InternalSerialize(const MessageLite* extendee,
                              int start_field_number, int end_field_number,
                              uint8_t* target,
                              io::EpsCopyOutputStream* stream) const {
    if (flat_size_ == 0) {
      assert(!is_large());
      return target;
    }
    return _InternalSerializeImpl(extendee, start_field_number,
                                  end_field_number, target, stream);
  }